

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mux.c
# Opt level: O2

int envy_bios_parse_mux(envy_bios *bios)

{
  uint8_t *res;
  uint8_t *res_00;
  uint8_t *res_01;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  envy_bios_mux_entry *peVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  char *__format;
  long lVar15;
  uint8_t sub [4];
  
  uVar3 = (bios->mux).offset;
  if (uVar3 == 0) {
    iVar11 = 0;
  }
  else {
    iVar4 = bios_u8(bios,(uint)uVar3,&(bios->mux).version);
    res = &(bios->mux).hlen;
    iVar5 = bios_u8(bios,(bios->mux).offset + 1,res);
    res_00 = &(bios->mux).entriesnum;
    iVar6 = bios_u8(bios,(bios->mux).offset + 2,res_00);
    res_01 = &(bios->mux).rlen;
    iVar7 = bios_u8(bios,(bios->mux).offset + 3,res_01);
    iVar11 = -0xe;
    if (iVar7 == 0 && (iVar6 == 0 && (iVar5 == 0 && iVar4 == 0))) {
      envy_bios_block(bios,(uint)(bios->mux).offset,
                      (uint)(bios->mux).entriesnum * (uint)(bios->mux).rlen + (uint)(bios->mux).hlen
                      ,"MUX",-1);
      bVar1 = (bios->mux).version;
      if (bVar1 == 0x10) {
        bVar1 = *res;
        uVar12 = (ulong)bVar1;
        if (bVar1 < 4) {
          __format = "MUX table header too short [%d < %d]\n";
          uVar14 = 4;
        }
        else {
          bVar2 = *res_01;
          if (4 < bVar2) {
            if (bVar1 != 4) {
              fprintf(_stderr,"MUX table header longer than expected [%d > %d]\n");
              bVar2 = *res_01;
            }
            if (5 < bVar2) {
              fprintf(_stderr,"MUX table record longer than expected [%d > %d]\n",(ulong)bVar2);
            }
            peVar9 = (envy_bios_mux_entry *)calloc((ulong)(bios->mux).entriesnum,0x14);
            (bios->mux).entries = peVar9;
            if (peVar9 != (envy_bios_mux_entry *)0x0) {
              lVar15 = 0xf;
              uVar14 = 0;
              do {
                if (*res_00 <= uVar14) {
                  (bios->mux).valid = '\x01';
                  return 0;
                }
                peVar9 = (bios->mux).entries;
                uVar10 = (uint)(bios->mux).rlen * (int)uVar14 +
                         (uint)(bios->mux).hlen + (uint)(bios->mux).offset;
                peVar9[uVar14].offset = (uint16_t)uVar10;
                uVar10 = bios_u8(bios,uVar10 & 0xffff,&peVar9[uVar14].idx);
                for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
                  uVar8 = bios_u8(bios,(uint)peVar9[uVar14].offset + (int)lVar13 + 1,sub + lVar13);
                  uVar10 = uVar10 | uVar8;
                  bVar1 = sub[lVar13];
                  peVar9->sub_loc[lVar13 + lVar15 + -0xf] = bVar1 & 1;
                  peVar9->sub_loc[lVar13 + lVar15 + -0xb] = bVar1 >> 1 & 0x1f;
                  peVar9->sub_loc[lVar13 + lVar15 + -7] = bVar1 >> 6 & 1;
                  peVar9->sub_loc[lVar13 + lVar15 + -3] = bVar1 >> 7;
                }
                uVar14 = uVar14 + 1;
                lVar15 = lVar15 + 0x14;
              } while (uVar10 == 0);
              return -0xe;
            }
            return -0xc;
          }
          __format = "MUX table record too short [%d < %d]\n";
          uVar14 = 5;
          uVar12 = (ulong)(uint)bVar2;
        }
      }
      else {
        uVar12 = (ulong)(bVar1 >> 4);
        uVar14 = (ulong)(bVar1 & 0xf);
        __format = "Unknown MUX table version %d.%d\n";
      }
      fprintf(_stderr,__format,uVar12,uVar14);
      iVar11 = -0x16;
    }
  }
  return iVar11;
}

Assistant:

int envy_bios_parse_mux (struct envy_bios *bios) {
	struct envy_bios_mux *mux = &bios->mux;
	if (!mux->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mux->offset, &mux->version);
	err |= bios_u8(bios, mux->offset+1, &mux->hlen);
	err |= bios_u8(bios, mux->offset+2, &mux->entriesnum);
	err |= bios_u8(bios, mux->offset+3, &mux->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, mux->offset, mux->hlen + mux->rlen * mux->entriesnum, "MUX", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (mux->version) {
		case 0x10:
			wanthlen = 4;
			wantrlen = 5;
			break;
		default:
			ENVY_BIOS_ERR("Unknown MUX table version %d.%d\n", mux->version >> 4, mux->version & 0xf);
			return -EINVAL;
	}
	if (mux->hlen < wanthlen) {
		ENVY_BIOS_ERR("MUX table header too short [%d < %d]\n", mux->hlen, wanthlen);
		return -EINVAL;
	}
	if (mux->rlen < wantrlen) {
		ENVY_BIOS_ERR("MUX table record too short [%d < %d]\n", mux->rlen, wantrlen);
		return -EINVAL;
	}
	if (mux->hlen > wanthlen) {
		ENVY_BIOS_WARN("MUX table header longer than expected [%d > %d]\n", mux->hlen, wanthlen);
	}
	if (mux->rlen > wantrlen) {
		ENVY_BIOS_WARN("MUX table record longer than expected [%d > %d]\n", mux->rlen, wantrlen);
	}
	mux->entries = calloc(mux->entriesnum, sizeof *mux->entries);
	if (!mux->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mux->entriesnum; i++) {
		struct envy_bios_mux_entry *entry = &mux->entries[i];
		entry->offset = mux->offset + mux->hlen + mux->rlen * i;
		uint8_t sub[4];
		err |= bios_u8(bios, entry->offset, &entry->idx);
		int j;
		for (j = 0; j < 4; j++) {
			err |= bios_u8(bios, entry->offset+j+1, &sub[j]);
			entry->sub_loc[j] = sub[j] & 1;
			entry->sub_line[j] = sub[j] >> 1 & 0x1f;
			entry->sub_val[j] = sub[j] >> 6 & 1;
			entry->sub_unk7[j] = sub[j] >> 7 & 1;
		}
		if (err)
			return -EFAULT;
	}
	mux->valid = 1;
	return 0;
}